

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawrend.h
# Opt level: O0

void __thiscall
CGL::DrawRend::DrawRend(DrawRend *this,vector<CGL::SVG_*,_std::allocator<CGL::SVG_*>_> *svgs_)

{
  vector<CGL::SVG_*,_std::allocator<CGL::SVG_*>_> *svgs__local;
  DrawRend *this_local;
  
  Renderer::Renderer(&this->super_Renderer);
  (this->super_Renderer)._vptr_Renderer = (_func_int **)&PTR__DrawRend_0029c088;
  std::vector<CGL::SVG_*,_std::allocator<CGL::SVG_*>_>::vector(&this->svgs,svgs_);
  this->current_svg = 0;
  std::vector<CGL::Matrix3x3,_std::allocator<CGL::Matrix3x3>_>::vector(&this->svg_to_ndc);
  Matrix3x3::Matrix3x3(&this->ndc_to_screen);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->framebuffer);
  std::
  vector<std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>,_std::allocator<std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>_>_>
  ::vector(&this->samplebuffer);
  return;
}

Assistant:

DrawRend(std::vector<SVG*> svgs_):
  svgs(svgs_), current_svg(0)
  {}